

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

void __thiscall
CNsc5BlockHelper::CNsc5BlockHelper
          (CNsc5BlockHelper *this,CNscPStackEntry *pNew,NscPCode5Block *pPrev,int nPrevIndex)

{
  int iVar1;
  uchar *puVar2;
  size_t sVar3;
  int in_ECX;
  long in_RDX;
  CNscPStackEntry *in_RSI;
  long *in_RDI;
  
  if (in_RSI == (CNscPStackEntry *)0x0) {
    if (in_RDX == 0) {
      *in_RDI = 0;
      in_RDI[1] = 0;
      *(undefined4 *)(in_RDI + 2) = 0xffffffff;
      *(undefined4 *)((long)in_RDI + 0x14) = 0xffffffff;
    }
    else {
      if (*(long *)(in_RDX + 0x10 + (long)in_ECX * 8) == 0) {
        *in_RDI = 0;
      }
      else {
        *in_RDI = in_RDX + *(long *)(in_RDX + 0x38 + (long)in_ECX * 8);
      }
      in_RDI[1] = *(long *)(in_RDX + 0x10 + (long)in_ECX * 8);
      *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RDX + 0x60 + (long)in_ECX * 4);
      *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)(in_RDX + 0x74 + (long)in_ECX * 4);
    }
  }
  else {
    puVar2 = CNscPStackEntry::GetData(in_RSI);
    *in_RDI = (long)puVar2;
    sVar3 = CNscPStackEntry::GetDataSize(in_RSI);
    in_RDI[1] = sVar3;
    iVar1 = CNscContext::GetFile(g_pCtx,0);
    *(int *)(in_RDI + 2) = iVar1;
    iVar1 = CNscContext::GetLine(g_pCtx,0);
    *(int *)((long)in_RDI + 0x14) = iVar1;
  }
  return;
}

Assistant:

CNsc5BlockHelper (CNscPStackEntry *pNew, 
		NscPCode5Block *pPrev, int nPrevIndex)
	{
		if (pNew)
		{
			m_pauchData = pNew ->GetData ();
			m_ulSize = pNew ->GetDataSize ();
			m_nFile = g_pCtx ->GetFile (0);
			m_nLine = g_pCtx ->GetLine (0);
		}
		else if (pPrev)
		{
			if (pPrev ->anSize [nPrevIndex] > 0)
			{
				m_pauchData = &((unsigned char *) pPrev) 
					[pPrev ->anOffset [nPrevIndex]];
			}
			else
			{
				m_pauchData = NULL;
			}
			m_ulSize = pPrev ->anSize [nPrevIndex];
			m_nFile = pPrev ->anFile [nPrevIndex];
			m_nLine = pPrev ->anLine [nPrevIndex];
		}
		else
		{
			m_pauchData = NULL;
			m_ulSize = 0;
			m_nFile = -1;
			m_nLine = -1;
		}
	}